

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *
tinyusdz::lerp<tinyusdz::value::point3d>
          (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *a,
          vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *b,double t)

{
  double *pdVar1;
  pointer ppVar2;
  ulong __new_size;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  point3d local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __new_size = ((long)(a->
                      super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar3 = ((long)(b->
                 super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(b->
                super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar3 < __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      while (bVar5 = __new_size != 0, __new_size = __new_size - 1, bVar5) {
        lerp<tinyusdz::value::point3d>
                  (&local_48,
                   (point3d *)
                   ((long)&((a->
                            super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                            )._M_impl.super__Vector_impl_data._M_start)->x + lVar4),
                   (point3d *)
                   ((long)&((b->
                            super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                            )._M_impl.super__Vector_impl_data._M_start)->x + lVar4),t);
        ppVar2 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)&ppVar2->z + lVar4) = local_48.z;
        pdVar1 = (double *)((long)&ppVar2->x + lVar4);
        *pdVar1 = local_48.x;
        pdVar1[1] = local_48.y;
        lVar4 = lVar4 + 0x18;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}